

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  iterator iVar4;
  _List_node_base *p_Var5;
  undefined1 local_9d;
  int32 srv_id_local;
  string local_98;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  ptr<buffer> new_conf_buf;
  ptr<peer> pp;
  ptr<log_entry> entry;
  
  srv_id_local = srv_id;
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar3 = (**(code **)(*(long *)peVar1 + 0x38))(), 2 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_98,"to-be-removed server %d already exists, cannot remove server %d for now"
                 ,(ulong)(uint)((((this->srv_to_leave_).
                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_,srv_id);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"rm_srv_from_cluster",0x1e3,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    return;
  }
  get_config((raft_server *)&cur_conf);
  if ((this->uncommitted_config_).
      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar3 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (this->uncommitted_config_).
               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_98,"uncommitted config exists at log %lu, prev log %lu",peVar2->log_idx_,
                 peVar2->prev_log_idx_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"rm_srv_from_cluster",0x1ee,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
               &(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
  }
  local_98._M_dataplus._M_p =
       (pointer)(**(code **)(*(long *)(this->log_store_).
                                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x10))();
  new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       log_idx_;
  std::make_shared<nuraft::cluster_config,unsigned_long,unsigned_long>
            ((unsigned_long *)&new_conf,(unsigned_long *)&local_98);
  p_Var5 = (_List_node_base *)
           &(cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->servers_;
  do {
    peVar2 = new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    do {
      p_Var5 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)
                    &(cur_conf.
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->servers_) {
        std::__cxx11::string::string
                  ((string *)&local_98,
                   (string *)
                   &(cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->user_ctx_);
        std::__cxx11::string::_M_assign((string *)&peVar2->user_ctx_);
        std::__cxx11::string::~string((string *)&local_98);
        (new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        async_replication_ =
             (cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->async_replication_;
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar1 != (element_type *)0x0) &&
           (iVar3 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar3)) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_98,
                     "removed server %d from configuration and save the configuration to log store at %lu"
                     ,(ulong)(uint)srv_id_local,
                     (new_conf.
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->log_idx_);
          (**(code **)(*(long *)peVar1 + 0x40))
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"rm_srv_from_cluster",0x203,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
        }
        this->config_changing_ = true;
        std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->uncommitted_config_).
                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
                   &new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)
        ;
        cluster_config::serialize((cluster_config *)&new_conf_buf);
        local_98._M_dataplus._M_p =
             (pointer)(((this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      term_).super___atomic_base<unsigned_long>._M_i;
        local_9d = 2;
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)timer_helper::get_timeofday_us();
        std::
        make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
                  ((unsigned_long *)&entry,(shared_ptr<nuraft::buffer> *)&local_98,
                   (log_val_type *)&new_conf_buf,(unsigned_long *)&local_9d);
        store_log_entry(this,&entry,0);
        iVar4 = std::
                _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->peers_)._M_h,&srv_id_local);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
            _M_cur != (__node_type *)0x0) {
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                            ._M_cur + 0x10));
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->srv_to_leave_).
                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                     &pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
          this->srv_to_leave_target_idx_ =
               (new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->log_idx_;
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (iVar3 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar3)) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_98,
                       "set srv_to_leave_, server %d will be removed from cluster, config %lu",
                       (ulong)(uint)srv_id_local,this->srv_to_leave_target_idx_);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"rm_srv_from_cluster",0x215,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        request_append_entries(this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return;
      }
    } while (*(int *)p_Var5[1]._M_next == srv_id);
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back(&(new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->servers_,(value_type *)(p_Var5 + 1));
  } while( true );
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id) {
    if (srv_to_leave_) {
        p_wn("to-be-removed server %d already exists, "
             "cannot remove server %d for now",
             srv_to_leave_->get_id(), srv_id);
        return;
    }

    ptr<cluster_config> cur_conf = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_conf = uncommitted_config_;
    }

    ptr<cluster_config> new_conf = cs_new<cluster_config>
                                   ( log_store_->next_slot(),
                                     cur_conf->get_log_idx() );
    for (auto it = cur_conf->get_servers().cbegin();
          it != cur_conf->get_servers().cend();
          ++it ) {
        if ((*it)->get_id() != srv_id) {
            new_conf->get_servers().push_back(*it);
        }
    }
    new_conf->set_user_ctx( cur_conf->get_user_ctx() );
    new_conf->set_async_replication
              ( cur_conf->is_async_replication() );

    p_in( "removed server %d from configuration and "
          "save the configuration to log store at %" PRIu64,
          srv_id,
          new_conf->get_log_idx() );

    config_changing_ = true;
    uncommitted_config_ = new_conf;
    ptr<buffer> new_conf_buf( new_conf->serialize() );
    ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                             new_conf_buf,
                                             log_val_type::conf,
                                             timer_helper::get_timeofday_us() ) );
    store_log_entry(entry);

    auto p_entry = peers_.find(srv_id);
    if (p_entry != peers_.end()) {
        ptr<peer> pp = p_entry->second;
        srv_to_leave_ = pp;
        srv_to_leave_target_idx_ = new_conf->get_log_idx();
        p_in("set srv_to_leave_, "
             "server %d will be removed from cluster, config %" PRIu64,
             srv_id, srv_to_leave_target_idx_);
    }

    request_append_entries();
}